

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O0

void envy_bios_print_power_unk4c(envy_bios *bios,FILE *out,uint mask)

{
  envy_bios_power_unk4c *peVar1;
  int local_2c;
  int i;
  envy_bios_power_unk4c *unk4c;
  uint mask_local;
  FILE *out_local;
  envy_bios *bios_local;
  
  peVar1 = &(bios->power).unk4c;
  if ((peVar1->offset != 0) && ((mask & 0x400) != 0)) {
    if ((bios->power).unk4c.valid == '\0') {
      fprintf((FILE *)out,"Failed to parse THERMAL ADJUSTMENT table at 0x%x, version %x\n",
              (ulong)peVar1->offset,(ulong)(bios->power).unk4c.version);
    }
    else {
      fprintf((FILE *)out,"THERMAL ADJUSTMENT table at 0x%x, version %x\n",(ulong)peVar1->offset,
              (ulong)(bios->power).unk4c.version);
      envy_bios_dump_hex(bios,out,peVar1->offset,(uint)(bios->power).unk4c.hlen,mask);
      if ((mask & 0x80000000) != 0) {
        fprintf((FILE *)out,"\n");
      }
      for (local_2c = 0; local_2c < (int)(uint)(bios->power).unk4c.entriesnum;
          local_2c = local_2c + 1) {
        envy_bios_dump_hex(bios,out,(bios->power).unk4c.entries[local_2c].offset,
                           (uint)(bios->power).unk4c.rlen,mask);
        if ((mask & 0x80000000) != 0) {
          fprintf((FILE *)out,"\n");
        }
      }
      fprintf((FILE *)out,"\n");
    }
  }
  return;
}

Assistant:

void envy_bios_print_power_unk4c(struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_power_unk4c *unk4c = &bios->power.unk4c;
	int i;

	if (!unk4c->offset || !(mask & ENVY_BIOS_PRINT_PERF))
		return;
	if (!unk4c->valid) {
		fprintf(out, "Failed to parse THERMAL ADJUSTMENT table at 0x%x, version %x\n", unk4c->offset, unk4c->version);
		return;
	}

	fprintf(out, "THERMAL ADJUSTMENT table at 0x%x, version %x\n", unk4c->offset, unk4c->version);
	envy_bios_dump_hex(bios, out, unk4c->offset, unk4c->hlen, mask);
	if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");

	for (i = 0; i < unk4c->entriesnum; i++) {
		envy_bios_dump_hex(bios, out, unk4c->entries[i].offset, unk4c->rlen, mask);
		if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");
	}

	fprintf(out, "\n");
}